

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TripWire.hpp
# Opt level: O2

vector<std::shared_ptr<std::atomic<bool>_>,_std::allocator<std::shared_ptr<std::atomic<bool>_>_>_> *
gmlc::concurrency::make_triplines
          (vector<std::shared_ptr<std::atomic<bool>_>,_std::allocator<std::shared_ptr<std::atomic<bool>_>_>_>
           *__return_storage_ptr__,int count)

{
  __shared_ptr<std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  vector<std::shared_ptr<std::atomic<bool>_>,_std::allocator<std::shared_ptr<std::atomic<bool>_>_>_>
  *__range2;
  shared_ptr<std::atomic<bool>_> *line;
  __shared_ptr<std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2> *this;
  __shared_ptr<std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::
  vector<std::shared_ptr<std::atomic<bool>_>,_std::allocator<std::shared_ptr<std::atomic<bool>_>_>_>
  ::vector(__return_storage_ptr__,(long)count,(allocator_type *)&local_40);
  p_Var1 = &((__return_storage_ptr__->
             super__Vector_base<std::shared_ptr<std::atomic<bool>_>,_std::allocator<std::shared_ptr<std::atomic<bool>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>;
  for (this = &((__return_storage_ptr__->
                super__Vector_base<std::shared_ptr<std::atomic<bool>_>,_std::allocator<std::shared_ptr<std::atomic<bool>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start)->
               super___shared_ptr<std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>; this != p_Var1;
      this = this + 1) {
    std::make_shared<std::atomic<bool>,bool>((bool *)&local_40);
    std::__shared_ptr<std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>::operator=(this,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<TriplineType> make_triplines(int count)
{
    std::vector<TriplineType> lines(count);
    for (auto& line : lines) {
        line = std::make_shared<std::atomic<bool>>(false);
    }
    return lines;
}